

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ggml.c
# Opt level: O0

void ggml_compute_forward_relu_f32(ggml_compute_params *params,ggml_tensor *src0,ggml_tensor *dst)

{
  int n_00;
  int iVar1;
  long in_RDX;
  ggml_tensor *in_RSI;
  int *in_RDI;
  int i;
  int nc;
  int n;
  int local_24;
  
  if ((*in_RDI != 0) && (*in_RDI != 2)) {
    iVar1 = ggml_nrows(in_RSI);
    n_00 = in_RSI->ne[0];
    for (local_24 = 0; local_24 < iVar1; local_24 = local_24 + 1) {
      ggml_vec_relu_f32(n_00,(float *)(*(long *)(in_RDX + 0x90) +
                                      (long)local_24 * *(long *)(in_RDX + 0x20)),
                        (float *)((long)in_RSI->data + (long)local_24 * in_RSI->nb[1]));
    }
  }
  return;
}

Assistant:

static void ggml_compute_forward_relu_f32(
        const struct ggml_compute_params * params,
        const struct ggml_tensor * src0,
        struct ggml_tensor * dst) {
    assert(params->ith == 0);
    assert(ggml_are_same_shape(src0, dst));

    if (params->type == GGML_TASK_INIT || params->type == GGML_TASK_FINALIZE) {
        return;
    }

    const int n  = ggml_nrows(src0);
    const int nc = src0->ne[0];

    assert(dst->nb[0]  == sizeof(float));
    assert(src0->nb[0] == sizeof(float));

    for (int i = 0; i < n; i++) {
        ggml_vec_relu_f32(nc,
                (float *) ((char *) dst->data  + i*( dst->nb[1])),
                (float *) ((char *) src0->data + i*(src0->nb[1])));
    }
}